

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall psy::C::Lexer::lexIntegerSuffix(Lexer *this,int suffixCnt)

{
  byte bVar1;
  bool bVar2;
  
  do {
    while( true ) {
      bVar2 = suffixCnt == 0;
      suffixCnt = suffixCnt + -1;
      if (bVar2) {
        return;
      }
      bVar1 = this->yychar_;
      if (bVar1 < 0x6c) break;
      if (bVar1 == 0x6c) {
        yyinput(this);
        if (this->yychar_ == 'l') goto LAB_002bcb6b;
        goto LAB_002bcb73;
      }
      if (bVar1 != 0x75) {
        return;
      }
LAB_002bcb34:
      yyinput(this);
      if ((this->yychar_ | 0x20) != 0x6c) {
        return;
      }
    }
    if (bVar1 != 0x4c) {
      if (bVar1 != 0x55) {
        return;
      }
      goto LAB_002bcb34;
    }
    yyinput(this);
    if (this->yychar_ == 'L') {
LAB_002bcb6b:
      yyinput(this);
    }
LAB_002bcb73:
    if ((this->yychar_ | 0x20) != 0x75) {
      return;
    }
  } while( true );
}

Assistant:

void Lexer::lexIntegerSuffix(int suffixCnt)
{
    if (!suffixCnt)
        return;

    switch(yychar_) {
        case 'u':
        case 'U':
            yyinput();
            switch (yychar_) {
                case 'l':
                case 'L':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'l':
            yyinput();
            if (yychar_ == 'l')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'L':
            yyinput();
            if (yychar_ == 'L')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;
    }
}